

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::protos::gen::ObservableEvents::Serialize(ObservableEvents *this,Message *msg)

{
  pointer pOVar1;
  uint8_t *src_begin;
  Message *msg_00;
  ObservableEvents_DataSourceInstanceStateChange *it;
  pointer this_00;
  
  pOVar1 = (this->instance_state_changes_).
           super__Vector_base<perfetto::protos::gen::ObservableEvents_DataSourceInstanceStateChange,_std::allocator<perfetto::protos::gen::ObservableEvents_DataSourceInstanceStateChange>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->instance_state_changes_).
                 super__Vector_base<perfetto::protos::gen::ObservableEvents_DataSourceInstanceStateChange,_std::allocator<perfetto::protos::gen::ObservableEvents_DataSourceInstanceStateChange>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pOVar1; this_00 = this_00 + 1
      ) {
    msg_00 = protozero::Message::BeginNestedMessageInternal(msg,1);
    ObservableEvents_DataSourceInstanceStateChange::Serialize(this_00,msg_00);
  }
  if (((this->_has_field_).super__Base_bitset<1UL>._M_w & 4) != 0) {
    protozero::Message::AppendTinyVarInt(msg,2,(uint)this->all_data_sources_started_);
  }
  src_begin = (uint8_t *)(this->unknown_fields_)._M_dataplus._M_p;
  protozero::Message::WriteToStream
            (msg,src_begin,src_begin + (this->unknown_fields_)._M_string_length);
  return;
}

Assistant:

void ObservableEvents::Serialize(::protozero::Message* msg) const {
  // Field 1: instance_state_changes
  for (auto& it : instance_state_changes_) {
    it.Serialize(msg->BeginNestedMessage<::protozero::Message>(1));
  }

  // Field 2: all_data_sources_started
  if (_has_field_[2]) {
    msg->AppendTinyVarInt(2, all_data_sources_started_);
  }

  msg->AppendRawProtoBytes(unknown_fields_.data(), unknown_fields_.size());
}